

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O0

void qsub(char *qtag,int flags)

{
  char *pcVar1;
  char *pcVar2;
  FILE *__stream;
  char *pcVar3;
  ushort **ppuVar4;
  uint in_ESI;
  char *in_RDI;
  bool bVar5;
  char *qroot;
  char *mark;
  char *cptr;
  FILE *qfp;
  char *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint local_5c;
  undefined8 in_stack_ffffffffffffffd8;
  int flags_00;
  undefined8 in_stack_ffffffffffffffe0;
  
  flags_00 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  qnum = atoi(in_RDI);
  if (qsub::line == (char *)0x0) {
    qsub::line = (char *)malloc(0x2000);
    qsub::qpath = (char *)malloc(0x2000);
    if (qsub::line == (char *)0x0) {
      fprintf(_stderr,"Malloc failed at %s:%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/qgen.c",
              0x90);
      exit(1);
    }
    if (qsub::qpath == (char *)0x0) {
      fprintf(_stderr,"Malloc failed at %s:%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/qgen.c",
              0x91);
      exit(1);
    }
  }
  pcVar2 = env_config(in_stack_ffffffffffffff88,(char *)0x10513b);
  sprintf(qsub::qpath,"%s%c%s.sql",pcVar2,0x2f,in_RDI);
  __stream = fopen64(qsub::qpath,"r");
  if (__stream != (FILE *)0x0) {
    rowcnt = rowcnt_dflt[qnum];
    varsub((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(int)in_stack_ffffffffffffffe0,flags_00);
    if ((in_ESI & 0x4000) != 0) {
      fprintf(_stdout,"--#SET ROWS_FETCH %d\n",(ulong)(uint)rowcnt);
    }
    while (pcVar2 = fgets(qsub::line,0x2000,__stream), pcVar2 != (char *)0x0) {
      pcVar2 = qsub::line;
      if ((in_ESI & 0x800) == 0) {
        strip_comments((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        pcVar2 = qsub::line;
      }
      while (pcVar3 = strchr(pcVar2,0x3a), pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
        pcVar3 = pcVar3 + 1;
        fprintf(_stdout,"%s",pcVar2);
        switch(*pcVar3) {
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
          in_stack_ffffffffffffff90 = qnum;
          atoi(pcVar3);
          varsub((int)((ulong)pcVar3 >> 0x20),(int)pcVar3,(int)((ulong)pcVar2 >> 0x20));
          do {
            ppuVar4 = __ctype_b_loc();
            pcVar2 = pcVar3 + 1;
            pcVar1 = pcVar3 + 1;
            pcVar3 = pcVar2;
          } while (((*ppuVar4)[(int)*pcVar1] & 0x800) != 0);
          break;
        default:
          fprintf(_stderr,"-- unknown flag \'%c%c\' ignored\n",0x3a,(ulong)(uint)(int)*pcVar3);
          pcVar2 = pcVar3 + 1;
          break;
        case 'B':
        case 'b':
          if ((in_ESI & 0x200) == 0) {
            fprintf(_stdout,"%s\n","");
          }
          pcVar2 = pcVar3 + 1;
          break;
        case 'C':
        case 'c':
          if ((in_ESI & 8) != 0) {
            fprintf(_stdout,"CONNECT TO %s ;\n",db_name);
          }
          pcVar2 = pcVar3 + 1;
          break;
        case 'E':
        case 'e':
          if ((in_ESI & 0x200) == 0) {
            fprintf(_stdout,"%s\n","COMMIT WORK;");
          }
          pcVar2 = pcVar3 + 1;
          break;
        case 'N':
        case 'n':
          if ((in_ESI & 0x4000) == 0) {
            pcVar3 = pcVar3 + 1;
            rowcnt = atoi(pcVar3);
            while( true ) {
              ppuVar4 = __ctype_b_loc();
              bVar5 = true;
              if (((*ppuVar4)[(int)*pcVar3] & 0x800) == 0) {
                bVar5 = *pcVar3 == ' ';
              }
              if (!bVar5) break;
              pcVar3 = pcVar3 + 1;
            }
            fprintf(_stdout,"--#SET ROWS_FETCH %d\n",(ulong)(uint)rowcnt);
          }
          break;
        case 'O':
        case 'o':
          if ((in_ESI & 2) != 0) {
            if (snum < 0) {
              local_5c = 0;
            }
            else {
              local_5c = snum;
            }
            fprintf(_stdout,"%s \'%s/%s.%d\'","",osuff,in_RDI,(ulong)local_5c);
          }
          pcVar2 = pcVar3 + 1;
          break;
        case 'Q':
        case 'q':
          fprintf(_stdout,"%s",in_RDI);
          pcVar2 = pcVar3 + 1;
          break;
        case 'S':
        case 's':
          in_stack_ffffffffffffff94 = snum;
          if (snum < 0) {
            in_stack_ffffffffffffff94 = 0;
          }
          fprintf(_stdout,"%d",(ulong)in_stack_ffffffffffffff94);
          pcVar2 = pcVar3 + 1;
          break;
        case 'X':
        case 'x':
          if ((in_ESI & 4) != 0) {
            fprintf(_stdout,"%s\n","SET CURRENT EXPLAIN SNAPSHOT ON;");
          }
          pcVar2 = pcVar3 + 1;
        }
      }
      fprintf(_stdout,"%s",pcVar2);
    }
    fclose(__stream);
    fflush(_stdout);
    return;
  }
  fprintf(_stderr,"Open failed for %s at %s:%d\n",qsub::qpath,
          "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/qgen.c",0x98);
  exit(1);
}

Assistant:

void
qsub(char *qtag, int flags)
{
static char *line = NULL,
    *qpath = NULL;
FILE *qfp;
char *cptr,
    *mark,
    *qroot = NULL;

    qnum = atoi(qtag);
    if (line == NULL)
        {
        line = malloc(BUFSIZ);
        qpath = malloc(BUFSIZ);
        MALLOC_CHECK(line);
        MALLOC_CHECK(qpath);
        }

    qroot = env_config(QDIR_TAG, QDIR_DFLT);
    sprintf(qpath, "%s%c%s.sql", 
		qroot, PATH_SEP, qtag);
    qfp = fopen(qpath, "r");
    OPEN_CHECK(qfp, qpath);

    rowcnt = rowcnt_dflt[qnum];
    varsub(qnum, 0, flags); /* set the variables */
    if (flags & DFLT_NUM)
        fprintf(ofp, SET_ROWCOUNT, rowcnt);
    while (fgets(line, BUFSIZ, qfp) != NULL)
        {
        if (!(flags & COMMENT))
            strip_comments(line);
        mark = line;
        while ((cptr = strchr(mark, VTAG)) != NULL)
            {
            *cptr = '\0';
             cptr++;
            fprintf(ofp,"%s", mark);
            switch(*cptr)
                {
                case 'b':
                case 'B':
                    if (!(flags & ANSI))
                        fprintf(ofp,"%s\n", START_TRAN);
                    cptr++;
                    break;
                case 'c':
                case 'C':
                    if (flags & DBASE)
                        fprintf(ofp, SET_DBASE, db_name);
                    cptr++;
                    break;
                case 'e':
                case 'E':
                    if (!(flags & ANSI))
                        fprintf(ofp,"%s\n", END_TRAN);
                    cptr++;
                    break;
                case 'n':
                case 'N':
                    if (!(flags & DFLT_NUM))
                        {
                        rowcnt=atoi(++cptr);
                        while (isdigit(*cptr) || *cptr == ' ') cptr++;
                        fprintf(ofp, SET_ROWCOUNT, rowcnt);
                        }
                    continue;
                case 'o':
                case 'O':
                    if (flags & OUTPUT)
                        fprintf(ofp,"%s '%s/%s.%d'", SET_OUTPUT, osuff, 
                            qtag, (snum < 0)?0:snum);
                    cptr++;
                    break;
                case 'q':
                case 'Q':
                    fprintf(ofp,"%s", qtag);
                    cptr++;
                    break;
                case 's':
                case 'S':
                    fprintf(ofp,"%d", (snum < 0)?0:snum);
                    cptr++;
                    break;
                case 'X':
                case 'x':
                    if (flags & EXPLAIN)
                        fprintf(ofp, "%s\n", GEN_QUERY_PLAN);
                    cptr++;
                    break;
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		case '8':
		case '9':
                    varsub(qnum, atoi(cptr), flags & DFLT);
                    while (isdigit(*++cptr));
                    break;
                default:
		    fprintf(stderr, "-- unknown flag '%c%c' ignored\n", 
                        VTAG, *cptr);
		    cptr++;
		    break;
                }
            mark=cptr;
            }
        fprintf(ofp,"%s", mark);
        }
    fclose(qfp);
    fflush(stdout);
    return;
}